

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_hdr.c
# Opt level: O0

size_t tool_header_cb(void *ptr,size_t size,size_t nmemb,void *userdata)

{
  int iVar1;
  ushort **ppuVar2;
  undefined8 uVar3;
  long lVar4;
  size_t sVar5;
  bool bVar6;
  CURL *curl;
  size_t fnlen;
  char *fntmp;
  char *enc_ptr;
  size_t len;
  char *filename;
  char *p;
  size_t rc;
  size_t failure;
  char *pcStack_60;
  int encoded_file_name;
  char *end;
  size_t cb;
  char *str;
  OutStruct *heads;
  OutStruct *outs;
  HdrCbData *hdrcbdata;
  void *userdata_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  heads = *userdata;
  str = *(char **)((long)userdata + 8);
  end = (char *)(size * nmemb);
  pcStack_60 = (char *)((long)ptr + (long)end);
  failure._4_4_ = 0;
  rc = (size_t)(int)(uint)(size * nmemb == 0);
  ptr_local = (void *)rc;
  if ((*(long *)(str + 0x18) != 0) &&
     (((cb = (size_t)ptr, outs = (OutStruct *)userdata, hdrcbdata = (HdrCbData *)userdata,
       userdata_local = (void *)nmemb, nmemb_local = size, size_local = (size_t)ptr,
       *(long *)(*(long *)(str + 0x18) + 0xb8) == 0 || (*(long *)(str + 0x10) == 0)) ||
      (p = (char *)fwrite(ptr,size,nmemb,*(FILE **)(str + 0x10)), ptr_local = p, p == end)))) {
    if (((((ulong)outs->stream & 1) != 0) && ((char *)0x14 < end)) &&
       (iVar1 = Curl_raw_nequal("Content-disposition:",(char *)cb,0x14), iVar1 != 0)) {
      filename = (char *)(cb + 0x14);
      while( true ) {
        while( true ) {
          bVar6 = false;
          if ((*filename != '\0') && (bVar6 = false, filename < pcStack_60)) {
            ppuVar2 = __ctype_b_loc();
            bVar6 = ((*ppuVar2)[(int)(uint)(byte)*filename] & 0x400) == 0;
          }
          if (!bVar6) break;
          filename = filename + 1;
        }
        if (pcStack_60 + -9 < filename) goto LAB_001082c1;
        iVar1 = memcmp(filename,"filename=",9);
        if (iVar1 == 0) break;
        while( true ) {
          bVar6 = false;
          if (filename < pcStack_60) {
            bVar6 = *filename != ';';
          }
          if (!bVar6) break;
          filename = filename + 1;
        }
      }
      filename = filename + 9;
      fntmp = strstr((char *)(cb + 0x14),"filename*=");
      if (fntmp != (char *)0x0) {
        fnlen = 0;
        curl = (CURL *)0x0;
        fntmp = fntmp + 10;
        fnlen = (size_t)strstr(fntmp,"UTF-8\'\'");
        if ((char *)fnlen != (char *)0x0) {
          uVar3 = curl_easy_init();
          lVar4 = fnlen + 7;
          sVar5 = strlen((char *)(fnlen + 7));
          len = curl_easy_unescape(uVar3,lVar4,sVar5 & 0xffffffff,&curl);
          curl_easy_cleanup(uVar3);
        }
        failure._4_4_ = 1;
        curl_mfprintf(_stderr,"STR=%s\n\n",len);
      }
      enc_ptr = end + -((long)filename - cb);
      if (failure._4_4_ == 0) {
        len = (size_t)parse_filename(filename,(size_t)enc_ptr);
      }
      if (len == 0) {
        return rc;
      }
      heads->filename = (char *)len;
      heads->alloc_filename = true;
      heads->is_cd_filename = true;
      heads->s_isreg = true;
      heads->fopened = false;
      heads->stream = (FILE *)0x0;
      *(undefined1 *)&outs->stream = 0;
    }
LAB_001082c1:
    ptr_local = end;
  }
  return (size_t)ptr_local;
}

Assistant:

size_t tool_header_cb(void *ptr, size_t size, size_t nmemb, void *userdata)
{
  struct HdrCbData *hdrcbdata = userdata;
  struct OutStruct *outs = hdrcbdata->outs;
  struct OutStruct *heads = hdrcbdata->heads;
  const char *str = ptr;
  const size_t cb = size * nmemb;
  const char *end = (char*)ptr + cb;

  int encoded_file_name = FALSE;
  
  /*
   * Once that libcurl has called back tool_header_cb() the returned value
   * is checked against the amount that was intended to be written, if
   * it does not match then it fails with CURLE_WRITE_ERROR. So at this
   * point returning a value different from sz*nmemb indicates failure.
   */
  size_t failure = (size * nmemb) ? 0 : 1;

  if(!heads->config)
    return failure;

#ifdef DEBUGBUILD
  if(size * nmemb > (size_t)CURL_MAX_HTTP_HEADER) {
    warnf(heads->config, "Header data exceeds single call write limit!\n");
    return failure;
  }
#endif

  /*
   * Write header data when curl option --dump-header (-D) is given.
   */

  if(heads->config->headerfile && heads->stream) {
    size_t rc = fwrite(ptr, size, nmemb, heads->stream);
    if(rc != cb)
      return rc;
  }

  /*
   * This callback sets the filename where output shall be written when
   * curl options --remote-name (-O) and --remote-header-name (-J) have
   * been simultaneously given and additionally server returns an HTTP
   * Content-Disposition header specifying a filename property.
   */

  if(hdrcbdata->honor_cd_filename &&
     (cb > 20) && checkprefix("Content-disposition:", str)) {
    const char *p = str + 20;

    /* look for the 'filename=' parameter
       (encoded filenames (*=) are not supported) */
    for(;;) {
      char *filename;
      size_t len;
	  char* enc_ptr;	  

      while(*p && (p < end) && !ISALPHA(*p))
        p++;
      if(p > end - 9)
        break;

      if(memcmp(p, "filename=", 9)) {
        /* no match, find next parameter */
        while((p < end) && (*p != ';'))
          p++;
        continue;
      }
      p += 9;

	  enc_ptr = strstr(str + 20, "filename*=");
      if (enc_ptr) {
	  	char* fntmp = NULL;
		size_t fnlen = 0;
        enc_ptr += 10;

		fntmp = strstr(enc_ptr, "UTF-8''");
				
		if (fntmp != NULL) 
		{
			CURL* curl;
			curl = curl_easy_init();
			filename = curl_easy_unescape(curl,  fntmp + 7, strlen(fntmp + 7),&fnlen);
			curl_easy_cleanup(curl);
		}
        encoded_file_name = TRUE;

		//filename = strdup
		fprintf(stderr, "STR=%s\n\n", filename);
      }
	  
      /* this expression below typecasts 'cb' only to avoid
         warning: signed and unsigned type in conditional expression
      */
      len = (ssize_t)cb - (p - str);
	  if (encoded_file_name == FALSE)
		filename = parse_filename(p, len);

      if(filename) {
        outs->filename = filename;
        outs->alloc_filename = TRUE;
        outs->is_cd_filename = TRUE;
        outs->s_isreg = TRUE;
        outs->fopened = FALSE;
        outs->stream = NULL;
        hdrcbdata->honor_cd_filename = FALSE;
        break;
      }
      else
        return failure;
    }
  }

  return cb;
}